

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O2

void __thiscall QFileInfo::QFileInfo(QFileInfo *this,QString *path)

{
  QFileInfoPrivate *this_00;
  
  this_00 = (QFileInfoPrivate *)operator_new(0x1e8);
  QFileInfoPrivate::QFileInfoPrivate(this_00,path);
  (this->d_ptr).d.ptr = this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  return;
}

Assistant:

QFileInfo::QFileInfo(const QString &path) : d_ptr(new QFileInfoPrivate(path))
{
}